

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpinternalsourcedata.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPInternalSourceData::ProcessRTPPacket
          (RTPInternalSourceData *this,RTPPacket *rtppack,RTPTime *receivetime,bool *stored,
          RTPSources *sources)

{
  list<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_> *this_00;
  uint uVar1;
  uint uVar2;
  RTPPacket *obj;
  byte bVar3;
  _List_node_base *p_Var4;
  const_iterator __position;
  bool bVar5;
  double tsunit;
  bool accept;
  bool onprobation;
  bool ispackethandled;
  RTPPacket *rtppack_local;
  
  *stored = false;
  tsunit = (this->super_RTPSourceData).timestampunit;
  rtppack_local = rtppack;
  if (tsunit < 0.0) {
    tsunit = RTPSourceData::INF_GetEstimatedTimestampUnit(&this->super_RTPSourceData);
  }
  RTPSourceStats::ProcessPacket
            (&(this->super_RTPSourceData).stats,rtppack,receivetime,tsunit,
             (this->super_RTPSourceData).ownssrc,&accept,
             (bool)(~(this->super_RTPSourceData).validated & this->probationtype != NoProbation),
             &onprobation);
  if (this->probationtype < ProbationStore) {
joined_r0x00131968:
    if (accept == false) {
      return 0;
    }
LAB_00131879:
    (this->super_RTPSourceData).validated = true;
  }
  else {
    if (this->probationtype != ProbationStore) {
      return -0x76;
    }
    if (onprobation == false) {
      accept = (bool)(accept & 1);
      goto joined_r0x00131968;
    }
    if ((accept & 1U) != 0) goto LAB_00131879;
    bVar3 = 1;
    if (((this->super_RTPSourceData).validated & 1U) == 0) goto LAB_0013188c;
  }
  if ((this->super_RTPSourceData).ownssrc == false) {
    (this->super_RTPSourceData).issender = true;
  }
  bVar3 = 0;
LAB_0013188c:
  ispackethandled = false;
  (*(sources->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x13])
            (sources,this,rtppack,(ulong)bVar3,&ispackethandled);
  if (ispackethandled == true) {
    *stored = true;
  }
  else {
    this_00 = &(this->super_RTPSourceData).packetlist;
    p_Var4 = (this->super_RTPSourceData).packetlist.
             super__List_base<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)this_00) {
      *stored = true;
      std::__cxx11::list<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>::push_back
                (this_00,&rtppack_local);
    }
    else {
      if (((this->super_RTPSourceData).validated == false) &&
         ((this->super_RTPSourceData).packetlist.
          super__List_base<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>._M_impl.
          _M_node._M_size == 0x20)) {
        obj = (RTPPacket *)p_Var4[1]._M_next;
        std::__cxx11::list<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>::pop_front
                  (this_00);
        RTPDelete<jrtplib::RTPPacket>(obj,(this->super_RTPSourceData).super_RTPMemoryObject.mgr);
        p_Var4 = (this->super_RTPSourceData).packetlist.
                 super__List_base<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>.
                 _M_impl._M_node.super__List_node_base._M_next;
        rtppack = rtppack_local;
      }
      uVar1 = rtppack->extseqnr;
      __position._M_node =
           (this->super_RTPSourceData).packetlist.
           super__List_base<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>._M_impl.
           _M_node.super__List_node_base._M_prev;
      bVar5 = false;
      while (!bVar5) {
        uVar2 = *(uint *)&__position._M_node[1]._M_next[2]._M_next;
        bVar5 = uVar2 <= uVar1;
        if (uVar1 < uVar2) {
          if (__position._M_node == p_Var4) {
            *stored = true;
            std::__cxx11::list<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>::
            push_front(this_00,&rtppack_local);
            return 0;
          }
          __position._M_node = (__position._M_node)->_M_prev;
        }
        else {
          if (uVar1 <= uVar2) {
            return 0;
          }
          __position._M_node = (__position._M_node)->_M_next;
          std::__cxx11::list<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>::insert
                    (this_00,__position,&rtppack_local);
          *stored = true;
        }
      }
    }
  }
  return 0;
}

Assistant:

int RTPInternalSourceData::ProcessRTPPacket(RTPPacket *rtppack,const RTPTime &receivetime,bool *stored,RTPSources *sources)
{
	bool accept,onprobation,applyprobation;
	double tsunit;
	
	*stored = false;
	
	if (timestampunit < 0) 
		tsunit = INF_GetEstimatedTimestampUnit();
	else
		tsunit = timestampunit;

#ifdef RTP_SUPPORT_PROBATION
	if (validated) 				// If the source is our own process, we can already be validated. No 
		applyprobation = false;		// probation should be applied in that case.
	else
	{
		if (probationtype == RTPSources::NoProbation)
			applyprobation = false;
		else
			applyprobation = true;
	}
#else
	applyprobation = false;
#endif // RTP_SUPPORT_PROBATION

	stats.ProcessPacket(rtppack,receivetime,tsunit,ownssrc,&accept,applyprobation,&onprobation);

#ifdef RTP_SUPPORT_PROBATION
	switch (probationtype)
	{
		case RTPSources::ProbationStore:
			if (!(onprobation || accept))
				return 0;
			if (accept)
				validated = true;
			break;
		case RTPSources::ProbationDiscard:
		case RTPSources::NoProbation:
			if (!accept)
				return 0;
			validated = true;
			break;
		default:
			return ERR_RTP_INTERNALSOURCEDATA_INVALIDPROBATIONTYPE;
	}
#else
	if (!accept)
		return 0;
	validated = true;
#endif // RTP_SUPPORT_PROBATION;
	
	if (validated && !ownssrc) // for own ssrc these variables depend on the outgoing packets, not on the incoming
		issender = true;
	
	bool isonprobation = !validated;
	bool ispackethandled = false;

	sources->OnValidatedRTPPacket(this, rtppack, isonprobation, &ispackethandled);
	if (ispackethandled) // Packet is already handled in the callback, no need to store it in the list
	{
		// Set 'stored' to true to avoid the packet being deallocated
		*stored = true;
		return 0;
	}

	// Now, we can place the packet in the queue
	
	if (packetlist.empty())
	{
		*stored = true;
		packetlist.push_back(rtppack);
		return 0;
	}
	
	if (!validated) // still on probation
	{
		// Make sure that we don't buffer too much packets to avoid wasting memory
		// on a bad source. Delete the packet in the queue with the lowest sequence
		// number.
		if (packetlist.size() == RTPINTERNALSOURCEDATA_MAXPROBATIONPACKETS)
		{
			RTPPacket *p = *(packetlist.begin());
			packetlist.pop_front();
			RTPDelete(p,GetMemoryManager());
		}
	}

	// find the right position to insert the packet
	
	std::list<RTPPacket*>::iterator it,start;
	bool done = false;
	uint32_t newseqnr = rtppack->GetExtendedSequenceNumber();
	
	it = packetlist.end();
	--it;
	start = packetlist.begin();
	
	while (!done)
	{
		RTPPacket *p;
		uint32_t seqnr;
		
		p = *it;
		seqnr = p->GetExtendedSequenceNumber();
		if (seqnr > newseqnr)
		{
			if (it != start)
				--it;
			else // we're at the start of the list
			{
				*stored = true;
				done = true;
				packetlist.push_front(rtppack);
			}
		}
		else if (seqnr < newseqnr) // insert after this packet
		{
			++it;
			packetlist.insert(it,rtppack);
			done = true;
			*stored = true;
		}
		else // they're equal !! Drop packet
		{
			done = true;
		}
	}

	return 0;
}